

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS
ref_part_meshb_geom_delete_me
          (REF_GEOM ref_geom,REF_INT ngeom,REF_INT type,REF_NODE ref_node,REF_INT nnode,FILE *file)

{
  undefined8 *puVar1;
  int *piVar2;
  REF_MPI ref_mpi;
  REF_DBL *pRVar3;
  REF_GEOM ref_geom_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  REF_GEOM pRVar9;
  uint *puVar10;
  undefined4 *puVar11;
  void *pvVar12;
  int iVar13;
  long lVar14;
  undefined8 uVar15;
  size_t __size;
  ulong uVar16;
  int iVar17;
  int iVar18;
  REF_INT dest;
  undefined4 in_register_00000084;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  REF_STATUS RVar23;
  size_t sVar24;
  int *local_110;
  REF_INT node;
  uint local_fc;
  double double_gref;
  REF_INT new_geom;
  REF_GEOM local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  REF_GEOM local_c8;
  uint *local_c0;
  FILE *local_b8;
  REF_GEOM local_b0;
  int local_a4;
  void *local_a0;
  REF_NODE local_98;
  void *local_90;
  ulong local_88;
  void *local_80;
  void *local_78;
  undefined4 *local_70;
  void *local_68;
  uint local_60;
  REF_INT end_of_message;
  undefined8 local_58;
  uint *local_50;
  int *local_48;
  long local_40;
  ulong local_38;
  
  ref_mpi = ref_node->ref_mpi;
  end_of_message = -1;
  uVar4 = ref_mpi->n;
  uVar5 = 1000000;
  if (1000000 < ngeom / (int)uVar4) {
    uVar5 = ngeom / (int)uVar4;
  }
  uVar21 = (ulong)uVar5;
  if (ngeom <= (int)uVar5) {
    uVar21 = (ulong)(uint)ngeom;
  }
  local_b0 = ref_geom;
  if (ngeom < 0) {
    pcVar19 = "malloc sent_node of REF_INT negative";
    uVar15 = 0xbc;
LAB_001706e3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_meshb_geom_delete_me",pcVar19);
LAB_001706ea:
    RVar23 = 1;
  }
  else {
    uVar5 = (uint)uVar21;
    sVar24 = uVar21 << 2;
    local_fc = type;
    local_b8 = (FILE *)file;
    local_58 = CONCAT44(in_register_00000084,nnode);
    local_d0 = malloc(sVar24);
    if (local_d0 == (void *)0x0) {
      pcVar19 = "malloc sent_node of REF_INT NULL";
      uVar15 = 0xbc;
    }
    else {
      pvVar8 = malloc(sVar24);
      if (pvVar8 == (void *)0x0) {
        pcVar19 = "malloc sent_id of REF_INT NULL";
        uVar15 = 0xbd;
      }
      else {
        local_d8 = pvVar8;
        local_e0 = malloc(sVar24);
        if (local_e0 == (void *)0x0) {
          pcVar19 = "malloc sent_gref of REF_INT NULL";
          uVar15 = 0xbe;
        }
        else {
          __size = (ulong)(uVar5 * 2) << 3;
          pRVar9 = (REF_GEOM)malloc(__size);
          ref_geom_00 = local_b0;
          local_e8 = pRVar9;
          if (pRVar9 == (REF_GEOM)0x0) {
            pcVar19 = "malloc sent_param of REF_DBL NULL";
            uVar15 = 0xbf;
          }
          else {
            if (ref_mpi->id != 0) {
              do {
                uVar4 = ref_mpi_scatter_recv(ref_mpi,&double_gref,1,1);
                if (uVar4 != 0) {
                  uVar21 = (ulong)uVar4;
                  pcVar19 = "recv";
                  uVar15 = 0x129;
                  goto LAB_00170e25;
                }
                if (0 < double_gref._0_4_) {
                  uVar4 = ref_mpi_scatter_recv(ref_mpi,local_d0,double_gref._0_4_,1);
                  if (uVar4 != 0) {
                    uVar21 = (ulong)uVar4;
                    pcVar19 = "send";
                    uVar15 = 0x12d;
                    goto LAB_00170e25;
                  }
                  uVar4 = ref_mpi_scatter_recv(ref_mpi,local_d8,double_gref._0_4_,1);
                  if (uVar4 != 0) {
                    uVar21 = (ulong)uVar4;
                    pcVar19 = "send";
                    uVar15 = 0x130;
                    goto LAB_00170e25;
                  }
                  uVar4 = ref_mpi_scatter_recv(ref_mpi,local_e0,double_gref._0_4_,1);
                  if (uVar4 != 0) {
                    uVar21 = (ulong)uVar4;
                    pcVar19 = "send";
                    uVar15 = 0x133;
                    goto LAB_00170e25;
                  }
                  uVar4 = ref_mpi_scatter_recv(ref_mpi,pRVar9,double_gref._0_4_ * 2,3);
                  if (uVar4 != 0) {
                    uVar21 = (ulong)uVar4;
                    pcVar19 = "send";
                    uVar15 = 0x136;
                    goto LAB_00170e25;
                  }
                  local_b0 = pRVar9;
                  for (lVar22 = 0; pRVar9 = local_e8, lVar22 < double_gref._0_4_;
                      lVar22 = lVar22 + 1) {
                    uVar5 = ref_node_local(ref_node,(long)*(int *)((long)local_d0 + lVar22 * 4),
                                           &node);
                    pvVar8 = local_d8;
                    uVar4 = local_fc;
                    if (uVar5 != 0) {
                      uVar21 = (ulong)uVar5;
                      pcVar19 = "g2l";
                      uVar15 = 0x138;
                      goto LAB_00170e25;
                    }
                    uVar5 = ref_geom_add(ref_geom_00,node,local_fc,
                                         *(REF_INT *)((long)local_d8 + lVar22 * 4),
                                         (REF_DBL *)local_b0);
                    if (uVar5 != 0) {
                      uVar21 = (ulong)uVar5;
                      pcVar19 = "add geom";
                      uVar15 = 0x13b;
                      goto LAB_00170e25;
                    }
                    uVar4 = ref_geom_find(ref_geom_00,node,uVar4,
                                          *(REF_INT *)((long)pvVar8 + lVar22 * 4),&new_geom);
                    if (uVar4 != 0) {
                      uVar21 = (ulong)uVar4;
                      pcVar19 = "find";
                      uVar15 = 0x13d;
                      goto LAB_00170e25;
                    }
                    ref_geom_00->descr[(long)new_geom * 6 + 2] =
                         *(REF_INT *)((long)local_e0 + lVar22 * 4);
                    local_b0 = (REF_GEOM)&local_b0->descr;
                  }
                }
              } while (double_gref._0_4_ != -1);
LAB_00170694:
              free(pRVar9);
              free(local_e0);
              free(local_d8);
              free(local_d0);
              return 0;
            }
            if ((int)uVar4 < 0) {
              pcVar19 = "malloc geom_to_send of REF_INT negative";
              uVar15 = 0xc2;
              goto LAB_001706e3;
            }
            puVar10 = (uint *)malloc((ulong)uVar4 << 2);
            if (puVar10 == (uint *)0x0) {
              pcVar19 = "malloc geom_to_send of REF_INT NULL";
              uVar15 = 0xc2;
            }
            else {
              local_c0 = puVar10;
              puVar11 = (undefined4 *)malloc((ulong)uVar4 << 2);
              if (puVar11 == (undefined4 *)0x0) {
                pcVar19 = "malloc start_to_send of REF_INT NULL";
                uVar15 = 0xc3;
              }
              else {
                local_70 = puVar11;
                pvVar8 = malloc(sVar24);
                if (pvVar8 == (void *)0x0) {
                  pcVar19 = "malloc read_node of REF_INT NULL";
                  uVar15 = 0xc4;
                }
                else {
                  pvVar12 = malloc(sVar24);
                  if (pvVar12 == (void *)0x0) {
                    pcVar19 = "malloc read_id of REF_INT NULL";
                    uVar15 = 0xc5;
                  }
                  else {
                    local_68 = pvVar12;
                    local_80 = malloc(sVar24);
                    if (local_80 == (void *)0x0) {
                      pcVar19 = "malloc read_gref of REF_INT NULL";
                      uVar15 = 0xc6;
                    }
                    else {
                      local_78 = malloc(__size);
                      if (local_78 == (void *)0x0) {
                        pcVar19 = "malloc read_param of REF_DBL NULL";
                        uVar15 = 199;
                      }
                      else {
                        local_a0 = malloc(sVar24);
                        if (local_a0 != (void *)0x0) {
                          uVar21 = 0;
                          if (0 < (int)local_fc) {
                            uVar21 = (ulong)local_fc;
                          }
                          local_38 = (ulong)((int)local_58 - 1);
                          local_40 = uVar21 + 1;
                          local_48 = local_70 + 1;
                          local_50 = local_c0 + 1;
                          iVar13 = 0;
                          local_90 = pvVar8;
                          while (puVar11 = local_70, puVar10 = local_c0, uVar4 = ngeom - iVar13,
                                uVar4 != 0 && iVar13 <= ngeom) {
                            local_60 = uVar4;
                            if ((int)uVar5 < (int)uVar4) {
                              local_60 = uVar5;
                            }
                            uVar21 = 0;
                            if (0 < (int)local_60) {
                              uVar21 = (ulong)local_60;
                            }
                            local_c8 = (REF_GEOM)local_78;
                            uVar16 = 0;
                            local_a4 = iVar13;
                            while (uVar16 != uVar21) {
                              sVar24 = fread((void *)((long)local_90 + uVar16 * 4),4,1,local_b8);
                              if (sVar24 != 1) {
                                pcVar19 = "n";
                                uVar15 = 0xce;
LAB_00171034:
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,uVar15,"ref_part_meshb_geom_delete_me",pcVar19,1,sVar24);
                                goto LAB_001706ea;
                              }
                              local_98 = (REF_NODE)((long)local_68 + uVar16 * 4);
                              sVar24 = fread(local_98,4,1,local_b8);
                              if (sVar24 != 1) {
                                pcVar19 = "n";
                                uVar15 = 0xcf;
                                goto LAB_00171034;
                              }
                              puVar1 = (undefined8 *)((long)local_78 + uVar16 * 0x10);
                              *puVar1 = 0;
                              puVar1[1] = 0;
                              pRVar9 = local_c8;
                              lVar22 = local_40;
                              local_88 = uVar16;
                              while (lVar22 = lVar22 + -1, lVar22 != 0) {
                                sVar24 = fread(pRVar9,8,1,local_b8);
                                pRVar9 = (REF_GEOM)((long)pRVar9 + 8);
                                if (sVar24 != 1) {
                                  pcVar19 = "param";
                                  uVar15 = 0xd4;
                                  goto LAB_00171034;
                                }
                              }
                              *(REF_INT *)((long)local_80 + local_88 * 4) = local_98->n;
                              if (0 < (int)local_fc) {
                                sVar24 = fread(&double_gref,8,1,local_b8);
                                if (sVar24 != 1) {
                                  pcVar19 = "gref";
                                  uVar15 = 0xd7;
                                  goto LAB_00171034;
                                }
                                *(int *)((long)local_80 + local_88 * 4) =
                                     (int)(double)CONCAT44(double_gref._4_4_,double_gref._0_4_);
                              }
                              local_c8 = (REF_GEOM)((long)local_c8 + 0x10);
                              uVar16 = local_88 + 1;
                            }
                            for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
                              piVar2 = (int *)((long)local_90 + uVar16 * 4);
                              *piVar2 = *piVar2 + -1;
                            }
                            for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
                              iVar13 = *(int *)((long)local_90 + uVar16 * 4);
                              iVar20 = ref_mpi->n;
                              iVar17 = ((int)local_38 + iVar20) / iVar20;
                              iVar18 = iVar13 / iVar17;
                              iVar6 = (int)((long)((ulong)(uint)((int)local_38 >> 0x1f) << 0x20 |
                                                  local_38 & 0xffffffff) / (long)iVar20);
                              iVar20 = (int)local_58 - iVar20 * iVar6;
                              if (iVar20 <= iVar18) {
                                iVar18 = (iVar13 - iVar17 * iVar20) / iVar6 + iVar20;
                              }
                              *(int *)((long)local_a0 + uVar16 * 4) = iVar18;
                            }
                            lVar22 = (long)ref_mpi->n;
                            for (lVar14 = 0; lVar14 < lVar22; lVar14 = lVar14 + 1) {
                              local_c0[lVar14] = 0;
                            }
                            for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
                              local_c0[*(int *)((long)local_a0 + uVar16 * 4)] =
                                   local_c0[*(int *)((long)local_a0 + uVar16 * 4)] + 1;
                            }
                            *local_70 = 0;
                            iVar13 = 0;
                            for (lVar14 = 1; lVar14 < lVar22; lVar14 = lVar14 + 1) {
                              iVar13 = iVar13 + local_c0[lVar14 + -1];
                              local_70[lVar14] = iVar13;
                            }
                            for (lVar14 = 0; lVar14 < lVar22; lVar14 = lVar14 + 1) {
                              local_c0[lVar14] = 0;
                            }
                            for (lVar22 = 0; uVar21 << 2 != lVar22; lVar22 = lVar22 + 4) {
                              iVar13 = *(int *)((long)local_a0 + lVar22);
                              uVar4 = local_c0[iVar13];
                              local_c0[iVar13] = uVar4 + 1;
                              lVar14 = (long)(int)local_70[iVar13] + (long)(int)uVar4;
                              *(undefined4 *)((long)local_d0 + lVar14 * 4) =
                                   *(undefined4 *)((long)local_90 + lVar22);
                              *(undefined4 *)((long)local_d8 + lVar14 * 4) =
                                   *(undefined4 *)((long)local_68 + lVar22);
                              *(undefined4 *)((long)local_e0 + lVar14 * 4) =
                                   *(undefined4 *)((long)local_80 + lVar22);
                              puVar1 = (undefined8 *)((long)local_78 + lVar22 * 4);
                              pRVar3 = (REF_DBL *)puVar1[1];
                              *(REF_DBL **)((long)&local_e8->n + (long)((int)lVar14 * 2) * 8) =
                                   (REF_DBL *)*puVar1;
                              ((REF_DBL **)((long)&local_e8->n + (long)((int)lVar14 * 2) * 8))[1] =
                                   pRVar3;
                            }
                            local_a4 = local_a4 + local_60;
                            uVar4 = *local_c0;
                            if ((int)*local_c0 < 1) {
                              uVar4 = 0;
                            }
                            local_88 = (ulong)uVar4;
                            local_c8 = local_e8;
                            local_98 = ref_node;
                            for (uVar21 = 0; local_88 != uVar21; uVar21 = uVar21 + 1) {
                              uVar7 = ref_node_local(local_98,(long)*(int *)((long)local_d0 +
                                                                            uVar21 * 4),&node);
                              pRVar9 = local_b0;
                              pvVar8 = local_d8;
                              uVar4 = local_fc;
                              if (uVar7 != 0) {
                                uVar21 = (ulong)uVar7;
                                pcVar19 = "g2l";
                                uVar15 = 0xf9;
                                goto LAB_00170e25;
                              }
                              uVar7 = ref_geom_add(local_b0,node,local_fc,
                                                   *(REF_INT *)((long)local_d8 + uVar21 * 4),
                                                   (REF_DBL *)local_c8);
                              if (uVar7 != 0) {
                                uVar21 = (ulong)uVar7;
                                pcVar19 = "add geom";
                                uVar15 = 0xfc;
                                goto LAB_00170e25;
                              }
                              uVar4 = ref_geom_find(pRVar9,node,uVar4,
                                                    *(REF_INT *)((long)pvVar8 + uVar21 * 4),
                                                    &new_geom);
                              if (uVar4 != 0) {
                                uVar21 = (ulong)uVar4;
                                pcVar19 = "find";
                                uVar15 = 0xfe;
                                goto LAB_00170e25;
                              }
                              pRVar9->descr[(long)new_geom * 6 + 2] =
                                   *(REF_INT *)((long)local_e0 + uVar21 * 4);
                              local_c8 = (REF_GEOM)&local_c8->descr;
                            }
                            local_110 = local_48;
                            puVar10 = local_50;
                            for (lVar22 = 1; ref_node = local_98, iVar13 = local_a4,
                                lVar22 < ref_mpi->n; lVar22 = lVar22 + 1) {
                              if (0 < (int)*puVar10) {
                                dest = (REF_INT)lVar22;
                                uVar4 = ref_mpi_scatter_send(ref_mpi,puVar10,1,1,dest);
                                if (uVar4 != 0) {
                                  uVar21 = (ulong)uVar4;
                                  pcVar19 = "send";
                                  uVar15 = 0x107;
                                  goto LAB_00170e25;
                                }
                                iVar13 = *local_110;
                                lVar14 = (long)iVar13;
                                uVar4 = ref_mpi_scatter_send
                                                  (ref_mpi,(void *)((long)local_d0 + lVar14 * 4),
                                                   *puVar10,1,dest);
                                if (uVar4 != 0) {
                                  uVar21 = (ulong)uVar4;
                                  pcVar19 = "send";
                                  uVar15 = 0x10a;
                                  goto LAB_00170e25;
                                }
                                uVar4 = ref_mpi_scatter_send
                                                  (ref_mpi,(void *)((long)local_d8 + lVar14 * 4),
                                                   *puVar10,1,dest);
                                if (uVar4 != 0) {
                                  uVar21 = (ulong)uVar4;
                                  pcVar19 = "send";
                                  uVar15 = 0x10d;
                                  goto LAB_00170e25;
                                }
                                uVar4 = ref_mpi_scatter_send
                                                  (ref_mpi,(void *)((long)local_e0 + lVar14 * 4),
                                                   *puVar10,1,dest);
                                if (uVar4 != 0) {
                                  uVar21 = (ulong)uVar4;
                                  pcVar19 = "send";
                                  uVar15 = 0x110;
                                  goto LAB_00170e25;
                                }
                                uVar4 = ref_mpi_scatter_send
                                                  (ref_mpi,(REF_DBL **)
                                                           ((long)&local_e8->n +
                                                           (long)(iVar13 * 2) * 8),*puVar10 * 2,3,
                                                   dest);
                                if (uVar4 != 0) {
                                  uVar21 = (ulong)uVar4;
                                  pcVar19 = "send";
                                  uVar15 = 0x114;
                                  goto LAB_00170e25;
                                }
                              }
                              local_110 = local_110 + 1;
                              puVar10 = puVar10 + 1;
                            }
                          }
                          free(local_a0);
                          free(local_78);
                          free(local_80);
                          free(local_68);
                          free(local_90);
                          free(puVar11);
                          free(puVar10);
                          pRVar9 = local_e8;
                          iVar13 = 1;
                          while (iVar13 < ref_mpi->n) {
                            uVar4 = ref_mpi_scatter_send(ref_mpi,&end_of_message,1,1,iVar13);
                            iVar13 = iVar13 + 1;
                            if (uVar4 != 0) {
                              uVar21 = (ulong)uVar4;
                              pcVar19 = "send";
                              uVar15 = 0x124;
LAB_00170e25:
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,uVar15,"ref_part_meshb_geom_delete_me",uVar21,pcVar19);
                              return (REF_STATUS)uVar21;
                            }
                          }
                          goto LAB_00170694;
                        }
                        pcVar19 = "malloc dest of REF_INT NULL";
                        uVar15 = 200;
                        local_a0 = (void *)0x0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_meshb_geom_delete_me",pcVar19);
    RVar23 = 2;
  }
  return RVar23;
}

Assistant:

REF_FCN REF_STATUS ref_part_meshb_geom_delete_me(REF_GEOM ref_geom,
                                                 REF_INT ngeom, REF_INT type,
                                                 REF_NODE ref_node,
                                                 REF_INT nnode, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT end_of_message = REF_EMPTY;
  REF_INT chunk;
  REF_INT *sent_node;
  REF_INT *sent_id;
  REF_INT *sent_gref;
  REF_DBL *sent_param;
  REF_INT *read_node;
  REF_INT *read_id;
  REF_INT *read_gref;
  REF_DBL *read_param;
  double double_gref;

  REF_INT ngeom_read, ngeom_keep;
  REF_INT section_size;

  REF_INT *dest;
  REF_INT *geom_to_send;
  REF_INT *start_to_send;

  REF_INT geom_to_receive;

  REF_INT geom, i, new_geom;
  REF_INT part, node;
  REF_INT new_location;

  chunk = MAX(1000000, ngeom / ref_mpi_n(ref_mpi));
  chunk = MIN(chunk, ngeom);

  ref_malloc(sent_node, chunk, REF_INT);
  ref_malloc(sent_id, chunk, REF_INT);
  ref_malloc(sent_gref, chunk, REF_INT);
  ref_malloc(sent_param, 2 * chunk, REF_DBL);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(geom_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(read_node, chunk, REF_INT);
    ref_malloc(read_id, chunk, REF_INT);
    ref_malloc(read_gref, chunk, REF_INT);
    ref_malloc(read_param, 2 * chunk, REF_DBL);
    ref_malloc(dest, chunk, REF_INT);

    ngeom_read = 0;
    while (ngeom_read < ngeom) {
      section_size = MIN(chunk, ngeom - ngeom_read);
      for (geom = 0; geom < section_size; geom++) {
        REIS(1, fread(&(read_node[geom]), sizeof(REF_INT), 1, file), "n");
        REIS(1, fread(&(read_id[geom]), sizeof(REF_INT), 1, file), "n");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_INT)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;

      ngeom_read += section_size;

      for (geom = 0; geom < section_size; geom++)
        dest[geom] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), read_node[geom]);

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) geom_to_send[dest[geom]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] = start_to_send[part - 1] + geom_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) {
        new_location = start_to_send[dest[geom]] + geom_to_send[dest[geom]];
        sent_node[new_location] = read_node[geom];
        sent_id[new_location] = read_id[geom];
        sent_gref[new_location] = read_gref[geom];
        sent_param[0 + 2 * new_location] = read_param[0 + 2 * geom];
        sent_param[1 + 2 * new_location] = read_param[1 + 2 * geom];
        geom_to_send[dest[geom]]++;
      }

      /* rank 0 keepers */
      ngeom_keep = geom_to_send[0];
      for (geom = 0; geom < ngeom_keep; geom++) {
        RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
        RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                         &(sent_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
      }

      /* ship it! */
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < geom_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(geom_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_node[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_id[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_gref[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi,
                                   &(sent_param[2 * start_to_send[part]]),
                                   2 * geom_to_send[part], REF_DBL_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(read_param);
    ref_free(read_gref);
    ref_free(read_id);
    ref_free(read_node);
    ref_free(start_to_send);
    ref_free(geom_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &geom_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (geom_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_node, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_id, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_gref, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_param, 2 * geom_to_receive,
                                 REF_DBL_TYPE),
            "send");
        for (geom = 0; geom < geom_to_receive; geom++) {
          RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
          RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                           &(sent_param[2 * geom])),
              "add geom");
          RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
              "find");
          ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
        }
      }
    } while (geom_to_receive != end_of_message);
  }

  free(sent_param);
  free(sent_gref);
  free(sent_id);
  free(sent_node);

  return REF_SUCCESS;
}